

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O0

void doInsertionSort(char *array,int32_t length,int32_t itemSize,UComparator *cmp,void *context,
                    void *pv)

{
  uint uVar1;
  char *__src;
  char *dest;
  int32_t insertionPoint;
  char *item;
  int32_t j;
  void *pv_local;
  void *context_local;
  UComparator *cmp_local;
  int32_t itemSize_local;
  int32_t length_local;
  char *array_local;
  
  for (item._4_4_ = 1; item._4_4_ < length; item._4_4_ = item._4_4_ + 1) {
    uVar1 = uprv_stableBinarySearch_63
                      (array,item._4_4_,array + item._4_4_ * itemSize,itemSize,cmp,context);
    if ((int)uVar1 < 0) {
      dest._4_4_ = uVar1 ^ 0xffffffff;
    }
    else {
      dest._4_4_ = uVar1 + 1;
    }
    if ((int)dest._4_4_ < item._4_4_) {
      __src = array + (int)(dest._4_4_ * itemSize);
      memcpy(pv,array + item._4_4_ * itemSize,(long)itemSize);
      memmove(__src + itemSize,__src,(long)(int)(item._4_4_ - dest._4_4_) * (long)itemSize);
      memcpy(__src,pv,(long)itemSize);
    }
  }
  return;
}

Assistant:

static void
doInsertionSort(char *array, int32_t length, int32_t itemSize,
                UComparator *cmp, const void *context, void *pv) {
    int32_t j;

    for(j=1; j<length; ++j) {
        char *item=array+j*itemSize;
        int32_t insertionPoint=uprv_stableBinarySearch(array, j, item, itemSize, cmp, context);
        if(insertionPoint<0) {
            insertionPoint=~insertionPoint;
        } else {
            ++insertionPoint;  /* one past the last equal item */
        }
        if(insertionPoint<j) {
            char *dest=array+insertionPoint*itemSize;
            uprv_memcpy(pv, item, itemSize);  /* v=array[j] */
            uprv_memmove(dest+itemSize, dest, (j-insertionPoint)*(size_t)itemSize);
            uprv_memcpy(dest, pv, itemSize);  /* array[insertionPoint]=v */
        }
    }
}